

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Dialog::configure_all(Dialog *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _List_node_base *p_Var5;
  
  iVar3 = al_get_display_width(this->display);
  iVar1 = this->grid_m;
  iVar4 = al_get_display_height(this->display);
  iVar2 = this->grid_n;
  p_Var5 = (_List_node_base *)&this->all_widgets;
  while (p_Var5 = (((_List_base<Widget_*,_std::allocator<Widget_*>_> *)&p_Var5->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&this->all_widgets) {
    Widget::configure((Widget *)p_Var5[1]._M_next,iVar3 / iVar1,iVar4 / iVar2,this->x_padding,
                      this->y_padding);
  }
  return;
}

Assistant:

void Dialog::configure_all()
{
   const int xsize = al_get_display_width(display) / this->grid_m;
   const int ysize = al_get_display_height(display) / this->grid_n;

   for (std::list<Widget*>::iterator it = this->all_widgets.begin();
         it != this->all_widgets.end();
         ++it)
   {
      (*it)->configure(xsize, ysize, this->x_padding, this->y_padding);
   }
}